

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O3

void aom_h_predictor_16x8_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined8 uVar2;
  long lVar3;
  uint8_t *puVar4;
  undefined1 (*pauVar5) [16];
  undefined1 auVar6 [16];
  undefined1 auVar12 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar14 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined4 local_18;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 uVar13;
  
  uVar1 = *(ulong *)left;
  uVar13 = (undefined1)(uVar1 >> 0x38);
  auVar11._8_6_ = 0;
  auVar11._0_8_ = uVar1;
  auVar11[0xe] = uVar13;
  auVar11[0xf] = uVar13;
  uVar13 = (undefined1)(uVar1 >> 0x30);
  auVar10._14_2_ = auVar11._14_2_;
  auVar10._8_5_ = 0;
  auVar10._0_8_ = uVar1;
  auVar10[0xd] = uVar13;
  auVar9._13_3_ = auVar10._13_3_;
  auVar9._8_4_ = 0;
  auVar9._0_8_ = uVar1;
  auVar9[0xc] = uVar13;
  uVar13 = (undefined1)(uVar1 >> 0x28);
  auVar8._12_4_ = auVar9._12_4_;
  auVar8._8_3_ = 0;
  auVar8._0_8_ = uVar1;
  auVar8[0xb] = uVar13;
  auVar7._11_5_ = auVar8._11_5_;
  auVar7._8_2_ = 0;
  auVar7._0_8_ = uVar1;
  auVar7[10] = uVar13;
  uVar13 = (undefined1)(uVar1 >> 0x20);
  auVar6._10_6_ = auVar7._10_6_;
  auVar6[8] = 0;
  auVar6._0_8_ = uVar1;
  auVar6[9] = uVar13;
  auVar14._9_7_ = auVar6._9_7_;
  auVar14[8] = uVar13;
  auVar14._0_8_ = uVar1;
  uVar13 = (undefined1)(uVar1 >> 0x18);
  auVar12._8_8_ = auVar14._8_8_;
  auVar12[7] = uVar13;
  auVar12[6] = uVar13;
  uVar13 = (undefined1)(uVar1 >> 0x10);
  auVar12[5] = uVar13;
  auVar12[4] = uVar13;
  uVar13 = (undefined1)(uVar1 >> 8);
  auVar12[3] = uVar13;
  auVar12[2] = uVar13;
  auVar12[0] = (undefined1)uVar1;
  auVar12[1] = auVar12[0];
  auVar14 = pshuflw(in_XMM1,auVar12,0);
  local_48._0_4_ = auVar14._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  auVar14 = pshuflw(local_48,auVar12,0x55);
  local_38._0_4_ = auVar14._0_4_;
  local_38._4_4_ = local_38._0_4_;
  local_38._8_4_ = local_38._0_4_;
  local_38._12_4_ = local_38._0_4_;
  auVar14 = pshuflw(local_38,auVar12,0xaa);
  local_28._0_4_ = auVar14._0_4_;
  local_28._4_4_ = local_28._0_4_;
  local_28._8_4_ = local_28._0_4_;
  local_28._12_4_ = local_28._0_4_;
  auVar14 = pshuflw(local_28,auVar12,0xff);
  local_18 = auVar14._0_4_;
  uStack_14 = local_18;
  uStack_10 = local_18;
  uStack_c = local_18;
  lVar3 = 0;
  pauVar5 = (undefined1 (*) [16])dst;
  do {
    auVar14 = *(undefined1 (*) [16])(local_48 + lVar3);
    *pauVar5 = auVar14;
    pauVar5 = (undefined1 (*) [16])(*pauVar5 + stride);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  puVar4 = dst + stride * 4;
  auVar14 = pshufhw(auVar14,auVar12,0);
  local_48._8_4_ = auVar14._8_4_;
  local_48._4_4_ = local_48._8_4_;
  local_48._0_4_ = local_48._8_4_;
  local_48._12_4_ = local_48._8_4_;
  auVar14 = pshufhw(local_48,auVar12,0x55);
  local_38._8_4_ = auVar14._8_4_;
  local_38._4_4_ = local_38._8_4_;
  local_38._0_4_ = local_38._8_4_;
  local_38._12_4_ = local_38._8_4_;
  auVar14 = pshufhw(local_38,auVar12,0xaa);
  local_28._4_4_ = auVar14._8_4_;
  local_28._0_4_ = local_28._4_4_;
  local_28._8_4_ = local_28._4_4_;
  local_28._12_4_ = local_28._4_4_;
  auVar12 = pshufhw(auVar12,auVar12,0xff);
  local_18 = auVar12._8_4_;
  uStack_14 = local_18;
  uStack_10 = local_18;
  uStack_c = local_18;
  lVar3 = 0;
  do {
    uVar2 = *(undefined8 *)(local_48 + lVar3 + 8);
    *(undefined8 *)puVar4 = *(undefined8 *)(local_48 + lVar3);
    *(undefined8 *)(puVar4 + 8) = uVar2;
    puVar4 = puVar4 + stride;
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x40);
  return;
}

Assistant:

void aom_h_predictor_16x8_sse2(uint8_t *dst, ptrdiff_t stride,
                               const uint8_t *above, const uint8_t *left) {
  (void)above;
  const __m128i left_col = _mm_loadl_epi64((const __m128i *)left);
  const __m128i left_col_8p = _mm_unpacklo_epi8(left_col, left_col);
  h_prediction_16x8_1(&left_col_8p, dst, stride);
  dst += stride << 2;
  h_prediction_16x8_2(&left_col_8p, dst, stride);
}